

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

web_seed_t * __thiscall
libtorrent::aux::torrent::add_web_seed
          (torrent *this,string *url,string *auth,headers_t *extra_headers,web_seed_flag_t flags)

{
  bool bVar1;
  pointer pwVar2;
  _Self local_178 [3];
  _List_node_base *local_160;
  _List_iterator<libtorrent::aux::web_seed_t> local_158;
  _Self local_150;
  _List_iterator<libtorrent::aux::web_seed_t> it;
  undefined1 local_140 [8];
  web_seed_t ent;
  headers_t *extra_headers_local;
  string *auth_local;
  string *url_local;
  torrent *this_local;
  reference pvStack_10;
  web_seed_flag_t flags_local;
  
  ent.have_files.super_bitfield.m_buf.
  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (bitfield)(bitfield)extra_headers;
  web_seed_t::web_seed_t((web_seed_t *)local_140,url,auth,extra_headers);
  it._M_node._5_1_ = 1;
  it._M_node._6_1_ = flags.m_val;
  it._M_node._7_1_ =
       libtorrent::flags::operator&
                 (flags.m_val,
                  (bitfield_flag<unsigned_char,_libtorrent::aux::web_seed_flag_tag,_void>)0x1);
  ent.peer_info._36_1_ =
       libtorrent::flags::bitfield_flag::operator_cast_to_bool
                 ((bitfield_flag *)((long)&it._M_node + 7));
  it._M_node._2_1_ = 2;
  it._M_node._3_1_ = flags.m_val;
  it._M_node._4_1_ =
       libtorrent::flags::operator&
                 (flags.m_val,
                  (bitfield_flag<unsigned_char,_libtorrent::aux::web_seed_flag_tag,_void>)0x2);
  ent.peer_info._37_1_ =
       libtorrent::flags::bitfield_flag::operator_cast_to_bool
                 ((bitfield_flag *)((long)&it._M_node + 4));
  local_158._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::begin
                 (&this->m_web_seeds);
  local_160 = (_List_node_base *)
              ::std::__cxx11::
              list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                        (&this->m_web_seeds);
  local_150._M_node =
       (_List_node_base *)
       ::std::find<std::_List_iterator<libtorrent::aux::web_seed_t>,libtorrent::aux::web_seed_t>
                 (local_158,(_List_iterator<libtorrent::aux::web_seed_t>)local_160,
                  (web_seed_t *)local_140);
  local_178[0]._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::end
                 (&this->m_web_seeds);
  bVar1 = ::std::operator!=(&local_150,local_178);
  if (bVar1) {
    pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_150);
    if (((pwVar2->ephemeral & 1U) != 0) && ((ent.peer_info._36_1_ & 1) == 0)) {
      set_need_save_resume(this,(resume_data_flags_t)0x80);
      pwVar2 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_150);
      pwVar2->ephemeral = false;
    }
    pvStack_10 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator*(&local_150);
  }
  else {
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::emplace_back<libtorrent::aux::web_seed_t>(&this->m_web_seeds,(web_seed_t *)local_140);
    if ((ent.peer_info._36_1_ & 1) == 0) {
      set_need_save_resume(this,(resume_data_flags_t)0x80);
    }
    update_want_tick(this);
    pvStack_10 = ::std::__cxx11::
                 list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
                 back(&this->m_web_seeds);
  }
  web_seed_t::~web_seed_t((web_seed_t *)local_140);
  return pvStack_10;
}

Assistant:

web_seed_t* torrent::add_web_seed(std::string const& url
		, std::string const& auth
		, web_seed_entry::headers_t const& extra_headers
		, web_seed_flag_t const flags)
	{
		web_seed_t ent(url, auth, extra_headers);
		ent.ephemeral = bool(flags & ephemeral);
		ent.no_local_ips = bool(flags & no_local_ips);

		// don't add duplicates
		auto const it = std::find(m_web_seeds.begin(), m_web_seeds.end(), ent);
		if (it != m_web_seeds.end())
		{
			// if we're adding a web seed (as non-ephemeral) and we have an
			// ephemeral web seed already, promote it to non-ephemeral
			if (it->ephemeral && !ent.ephemeral)
			{
				set_need_save_resume(torrent_handle::if_metadata_changed);
				it->ephemeral = false;
			}
			return &*it;
		}
		m_web_seeds.emplace_back(std::move(ent));

		// ephemeral web seeds are not saved in the resume data
		if (!ent.ephemeral)
			set_need_save_resume(torrent_handle::if_metadata_changed);

		update_want_tick();
		return &m_web_seeds.back();
	}